

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<Symbol>::growAppend(QCommonArrayOps<Symbol> *this,Symbol *b,Symbol *e)

{
  long n;
  Symbol *pSVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<Symbol> local_48;
  Symbol *b_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  b_local = b;
  if (b != e) {
    n = ((long)e - (long)b) / 0x30;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (Symbol *)0x0;
    pSVar1 = (this->super_Type).super_QGenericArrayOps<Symbol>.super_QArrayDataPointer<Symbol>.ptr;
    if ((b < pSVar1) ||
       (pSVar1 + (this->super_Type).super_QGenericArrayOps<Symbol>.super_QArrayDataPointer<Symbol>.
                 size <= b)) {
      QArrayDataPointer<Symbol>::detachAndGrow
                ((QArrayDataPointer<Symbol> *)this,GrowsAtEnd,n,(Symbol **)0x0,
                 (QArrayDataPointer<Symbol> *)0x0);
      pSVar1 = b;
    }
    else {
      QArrayDataPointer<Symbol>::detachAndGrow
                ((QArrayDataPointer<Symbol> *)this,GrowsAtEnd,n,&b_local,&local_48);
      pSVar1 = b_local;
    }
    QGenericArrayOps<Symbol>::copyAppend
              ((QGenericArrayOps<Symbol> *)this,pSVar1,
               (Symbol *)(((long)e - (long)b) + (long)pSVar1));
    QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }